

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_SHP(TT_ExecContext exc)

{
  FT_Bool FVar1;
  ushort point_00;
  FT_F26Dot6 FStack_68;
  FT_UShort point;
  FT_F26Dot6 dy;
  FT_F26Dot6 dx;
  undefined1 local_50 [6];
  FT_UShort refp;
  TT_GlyphZoneRec zp;
  TT_ExecContext exc_local;
  
  zp._56_8_ = exc;
  if (exc->top < (exc->GS).loop) {
    if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
  }
  else {
    FVar1 = Compute_Point_Displacement
                      (exc,&dy,&stack0xffffffffffffff98,(TT_GlyphZone)local_50,
                       (FT_UShort *)((long)&dx + 6));
    if (FVar1 != '\0') {
      return;
    }
    while (0 < *(long *)(zp._56_8_ + 0x230)) {
      *(long *)(zp._56_8_ + 0x38) = *(long *)(zp._56_8_ + 0x38) + -1;
      point_00 = (ushort)*(undefined8 *)
                          (*(long *)(zp._56_8_ + 0x30) + *(long *)(zp._56_8_ + 0x38) * 8);
      if (point_00 < *(ushort *)(zp._56_8_ + 0xd4)) {
        Move_Zp2_Point((TT_ExecContext)zp._56_8_,point_00,dy,FStack_68,'\x01');
      }
      else if (*(char *)(zp._56_8_ + 0x3c9) != '\0') {
        *(undefined4 *)(zp._56_8_ + 0x18) = 0x86;
        return;
      }
      *(long *)(zp._56_8_ + 0x230) = *(long *)(zp._56_8_ + 0x230) + -1;
    }
  }
  *(undefined8 *)(zp._56_8_ + 0x230) = 1;
  *(undefined8 *)(zp._56_8_ + 0x40) = *(undefined8 *)(zp._56_8_ + 0x38);
  return;
}

Assistant:

static void
  Ins_SHP( TT_ExecContext  exc )
  {
    TT_GlyphZoneRec  zp;
    FT_UShort        refp;

    FT_F26Dot6       dx, dy;
    FT_UShort        point;


    if ( exc->top < exc->GS.loop )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      goto Fail;
    }

    if ( Compute_Point_Displacement( exc, &dx, &dy, &zp, &refp ) )
      return;

    while ( exc->GS.loop > 0 )
    {
      exc->args--;
      point = (FT_UShort)exc->stack[exc->args];

      if ( BOUNDS( point, exc->zp2.n_points ) )
      {
        if ( exc->pedantic_hinting )
        {
          exc->error = FT_THROW( Invalid_Reference );
          return;
        }
      }
      else
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      /* doesn't follow Cleartype spec but produces better result */
      if ( SUBPIXEL_HINTING_INFINALITY && exc->ignore_x_mode )
        Move_Zp2_Point( exc, point, 0, dy, TRUE );
      else
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */
        Move_Zp2_Point( exc, point, dx, dy, TRUE );

      exc->GS.loop--;
    }

  Fail:
    exc->GS.loop = 1;
    exc->new_top = exc->args;
  }